

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O0

void __thiscall CJsonWriter::WriteIntValue(CJsonWriter *this,int Value)

{
  uint in_ESI;
  CJsonWriter *in_RDI;
  long in_FS_OFFSET;
  char aBuf [32];
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 EndElement;
  char *buffer;
  char local_28 [32];
  long local_8;
  
  EndElement = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CanWriteDatatype((CJsonWriter *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(char *)0x23de09);
  uVar1 = 0;
  WriteIndent(in_RDI,(bool)EndElement);
  buffer = local_28;
  str_format(buffer,0x20,"%d",(ulong)in_ESI);
  WriteInternal(in_RDI,buffer);
  CompleteDataType((CJsonWriter *)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CJsonWriter::WriteIntValue(int Value)
{
	dbg_assert(CanWriteDatatype(), "Cannot write value at this position");
	WriteIndent(false);
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d", Value);
	WriteInternal(aBuf);
	CompleteDataType();
}